

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O1

void dtl_json_reader_create(dtl_json_reader_t *self)

{
  dtl_json_readerData_t *pdVar1;
  
  if (self != (dtl_json_reader_t *)0x0) {
    self->lastError = 0;
    self->lineNumber = 1;
    self->pBegin = (uint8_t *)0x0;
    self->pEnd = (uint8_t *)0x0;
    self->eof = false;
    self->parseComplete = false;
    self->parseState = '\0';
    pdVar1 = dtl_json_readerData_new();
    self->data = pdVar1;
    adt_bytearray_create(&self->parseBuf,0x2000);
    bstr_context_create(&self->ctx);
    adt_stack_create(self,dtl_json_readerData_vdelete);
    return;
  }
  return;
}

Assistant:

static void dtl_json_reader_create(dtl_json_reader_t *self)
{
   if (self != 0)
   {
      self->eof = false;
      self->parseComplete = false;
      self->pBegin = 0;
      self->pEnd = 0;
      self->lastError = DTL_JSON_NO_ERROR;
      self->lineNumber = 1u;
      self->parseState = PARSE_STATE_NONE;
      self->data = dtl_json_readerData_new();
      adt_bytearray_create(&self->parseBuf, ADT_BYTE_ARRAY_DEFAULT_GROW_SIZE);
      bstr_context_create(&self->ctx);
      adt_stack_create(&self->stack, dtl_json_readerData_vdelete);
   }
}